

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::rehash
          (Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  Entry *pEVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  ulong uVar16;
  Node<QNetworkRequest::KnownHeaders,_QVariant> *pNVar17;
  ulong uVar18;
  Span *pSVar19;
  size_t index;
  long lVar20;
  size_t numBuckets;
  long lVar21;
  long in_FS_OFFSET;
  R RVar22;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar20 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar20 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar22 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar22.spans;
  this->numBuckets = numBuckets;
  pSVar19 = pSVar3;
  for (uVar18 = 0; uVar18 != uVar2 >> 7; uVar18 = uVar18 + 1) {
    for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 1) {
      uVar16 = (ulong)pSVar19->offsets[lVar20];
      if (uVar16 != 0xff) {
        pEVar4 = pSVar3[uVar18].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<QNetworkRequest::KnownHeaders>(this,(KnownHeaders *)(pEVar4 + uVar16))
        ;
        pNVar17 = Bucket::insert(&local_48);
        pNVar17->key = *(KnownHeaders *)pEVar4[uVar16].storage.data;
        puVar1 = pEVar4[uVar16].storage.data + 8;
        pPVar5 = *(PrivateShared **)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 8);
        puVar1 = pEVar4[uVar16].storage.data + 0x18;
        uVar8 = puVar1[8];
        uVar9 = puVar1[9];
        uVar10 = puVar1[10];
        uVar11 = puVar1[0xb];
        uVar12 = puVar1[0xc];
        uVar13 = puVar1[0xd];
        uVar14 = puVar1[0xe];
        uVar15 = puVar1[0xf];
        *(undefined8 *)((long)&(pNVar17->value).d.data + 0x10) = *(undefined8 *)puVar1;
        (pNVar17->value).d.field_0x18 = uVar8;
        (pNVar17->value).d.field_0x19 = uVar9;
        (pNVar17->value).d.field_0x1a = uVar10;
        (pNVar17->value).d.field_0x1b = uVar11;
        (pNVar17->value).d.field_0x1c = uVar12;
        (pNVar17->value).d.field_0x1d = uVar13;
        (pNVar17->value).d.field_0x1e = uVar14;
        (pNVar17->value).d.field_0x1f = uVar15;
        (pNVar17->value).d.data.shared = pPVar5;
        *(undefined8 *)((long)&(pNVar17->value).d.data + 8) = uVar6;
        puVar1 = pEVar4[uVar16].storage.data + 8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        pEVar7 = pEVar4 + uVar16;
        (pEVar7->storage).data[0x18] = '\0';
        (pEVar7->storage).data[0x19] = '\0';
        (pEVar7->storage).data[0x1a] = '\0';
        (pEVar7->storage).data[0x1b] = '\0';
        (pEVar7->storage).data[0x1c] = '\0';
        (pEVar7->storage).data[0x1d] = '\0';
        (pEVar7->storage).data[0x1e] = '\0';
        (pEVar7->storage).data[0x1f] = '\0';
        pEVar4 = pEVar4 + uVar16;
        (pEVar4->storage).data[0x20] = '\x02';
        (pEVar4->storage).data[0x21] = '\0';
        (pEVar4->storage).data[0x22] = '\0';
        (pEVar4->storage).data[0x23] = '\0';
        (pEVar4->storage).data[0x24] = '\0';
        (pEVar4->storage).data[0x25] = '\0';
        (pEVar4->storage).data[0x26] = '\0';
        (pEVar4->storage).data[0x27] = '\0';
      }
    }
    Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::freeData(pSVar3 + uVar18);
    pSVar19 = pSVar19 + 1;
  }
  if (pSVar3 != (Span *)0x0) {
    lVar20 = *(long *)&pSVar3[-1].allocated;
    if (lVar20 != 0) {
      lVar21 = lVar20 * 0x90;
      do {
        Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::freeData
                  ((Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *)
                   (pSVar3[-1].offsets + lVar21));
        lVar21 = lVar21 + -0x90;
      } while (lVar21 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar20 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }